

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunay.c
# Opt level: O0

GLfloat getDistanceToClosestPoint(DelaunayTriangulation *delTri,GLfloat *point)

{
  GLsizei GVar1;
  float fVar2;
  float fVar3;
  GLfloat dy;
  GLfloat dx;
  GLsizei idx;
  GLfloat *point_local;
  DelaunayTriangulation *delTri_local;
  
  GVar1 = getPointIndex(delTri,point);
  if (GVar1 == -1) {
    delTri_local._4_4_ = INFINITY;
  }
  else {
    fVar2 = *point - delTri->points[GVar1][0];
    fVar3 = point[1] - delTri->points[GVar1][1];
    delTri_local._4_4_ = fVar2 * fVar2 + fVar3 * fVar3;
  }
  return delTri_local._4_4_;
}

Assistant:

GLfloat getDistanceToClosestPoint(DelaunayTriangulation *delTri, GLfloat point[2]) {
	GLsizei idx = getPointIndex(delTri, point);
	if (idx != -1) {
		GLfloat dx, dy;
		dx = point[0] - delTri->points[idx][0];
		dy = point[1] - delTri->points[idx][1];
		return dx * dx + dy * dy;
	}
	else {
		return INFINITY;
	}
}